

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall DSectorScrollInterpolation::Destroy(DSectorScrollInterpolation *this)

{
  if (this->sector != (sector_t_conflict *)0x0) {
    this->sector->interpolations[(ulong)(this->ceiling ^ 1) + 2].field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
    this->sector = (sector_t_conflict *)0x0;
    DInterpolation::Destroy(&this->super_DInterpolation);
    return;
  }
  FInterpolator::RemoveInterpolation(&interpolator,&this->super_DInterpolation);
  (this->super_DInterpolation).refcount = 0;
  DObject::Destroy((DObject *)this);
  return;
}

Assistant:

void DSectorScrollInterpolation::Destroy()
{
	if (sector != nullptr)
	{
		if (ceiling)
		{
			sector->interpolations[sector_t::CeilingScroll] = nullptr;
		}
		else
		{
			sector->interpolations[sector_t::FloorScroll] = nullptr;
		}
		sector = nullptr;
	}
	Super::Destroy();
}